

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int unres_schema_dup(lys_module *mod,unres_schema *unres,void *item,UNRES_ITEM type,void *new_item)

{
  int iVar1;
  lys_node *snode;
  char *pcVar2;
  unres_iffeat_data *iff_data;
  unres_list_uniq aux_uniq;
  int i;
  void *new_item_local;
  unres_iffeat_data **ppuStack_28;
  UNRES_ITEM type_local;
  void *item_local;
  unres_schema *unres_local;
  lys_module *mod_local;
  
  if ((((item == (void *)0x0) || (new_item == (void *)0x0)) || (type == UNRES_LEAFREF)) ||
     ((type == UNRES_INSTID || (type == UNRES_WHEN)))) {
    __assert_fail("item && new_item && ((type != UNRES_LEAFREF) && (type != UNRES_INSTID) && (type != UNRES_WHEN))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x1daa,
                  "int unres_schema_dup(struct lys_module *, struct unres_schema *, void *, enum UNRES_ITEM, void *)"
                 );
  }
  ppuStack_28 = (unres_iffeat_data **)item;
  if (type == UNRES_LIST_UNIQ) {
    aux_uniq.list = *(lys_node **)((long)new_item + 8);
    ppuStack_28 = &iff_data;
    iff_data = (unres_iffeat_data *)item;
  }
  aux_uniq.trg_type._4_4_ = unres_schema_find(unres,-1,ppuStack_28,type);
  if (aux_uniq.trg_type._4_4_ != -1) {
    if (((type == UNRES_TYPE_LEAFREF) || (type == UNRES_USES)) ||
       ((type == UNRES_TYPE_DFLT || ((type == UNRES_FEATURE || (type == UNRES_LIST_UNIQ)))))) {
      iVar1 = unres_schema_add_node
                        (mod,unres,new_item,type,
                         (lys_node *)unres->str_snode[aux_uniq.trg_type._4_4_]);
      if (iVar1 == -1) {
        ly_log(mod->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
               ,0x1dbe);
        return -1;
      }
    }
    else if (type == UNRES_IFFEAT) {
      snode = (lys_node *)malloc(0x18);
      if (snode == (lys_node *)0x0) {
        ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","unres_schema_dup");
        return -1;
      }
      pcVar2 = lydict_insert(mod->ctx,*(char **)((long)unres->str_snode[aux_uniq.trg_type._4_4_] + 8
                                                ),0);
      snode->dsc = pcVar2;
      snode->name = *unres->str_snode[aux_uniq.trg_type._4_4_];
      *(undefined4 *)&snode->ref =
           *(undefined4 *)((long)unres->str_snode[aux_uniq.trg_type._4_4_] + 0x10);
      iVar1 = unres_schema_add_node(mod,unres,new_item,UNRES_IFFEAT,snode);
      if (iVar1 == -1) {
        ly_log(mod->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
               ,0x1dc9);
        return -1;
      }
    }
    else {
      iVar1 = unres_schema_add_str
                        (mod,unres,new_item,type,(char *)unres->str_snode[aux_uniq.trg_type._4_4_]);
      if (iVar1 == -1) {
        ly_log(mod->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
               ,0x1dce);
        return -1;
      }
    }
    return 0;
  }
  if (type == UNRES_LIST_UNIQ) {
    free(new_item);
  }
  return 1;
}

Assistant:

int
unres_schema_dup(struct lys_module *mod, struct unres_schema *unres, void *item, enum UNRES_ITEM type, void *new_item)
{
    int i;
    struct unres_list_uniq aux_uniq;
    struct unres_iffeat_data *iff_data;

    assert(item && new_item && ((type != UNRES_LEAFREF) && (type != UNRES_INSTID) && (type != UNRES_WHEN)));

    /* hack for UNRES_LIST_UNIQ, which stores multiple items behind its item */
    if (type == UNRES_LIST_UNIQ) {
        aux_uniq.list = item;
        aux_uniq.expr = ((struct unres_list_uniq *)new_item)->expr;
        item = &aux_uniq;
    }
    i = unres_schema_find(unres, -1, item, type);

    if (i == -1) {
        if (type == UNRES_LIST_UNIQ) {
            free(new_item);
        }
        return EXIT_FAILURE;
    }

    if ((type == UNRES_TYPE_LEAFREF) || (type == UNRES_USES) || (type == UNRES_TYPE_DFLT) ||
            (type == UNRES_FEATURE) || (type == UNRES_LIST_UNIQ)) {
        if (unres_schema_add_node(mod, unres, new_item, type, unres->str_snode[i]) == -1) {
            LOGINT(mod->ctx);
            return -1;
        }
    } else if (type == UNRES_IFFEAT) {
        /* duplicate unres_iffeature_data */
        iff_data = malloc(sizeof *iff_data);
        LY_CHECK_ERR_RETURN(!iff_data, LOGMEM(mod->ctx), -1);
        iff_data->fname = lydict_insert(mod->ctx, ((struct unres_iffeat_data *)unres->str_snode[i])->fname, 0);
        iff_data->node = ((struct unres_iffeat_data *)unres->str_snode[i])->node;
        iff_data->infeature = ((struct unres_iffeat_data *)unres->str_snode[i])->infeature;
        if (unres_schema_add_node(mod, unres, new_item, type, (struct lys_node *)iff_data) == -1) {
            LOGINT(mod->ctx);
            return -1;
        }
    } else {
        if (unres_schema_add_str(mod, unres, new_item, type, unres->str_snode[i]) == -1) {
            LOGINT(mod->ctx);
            return -1;
        }
    }

    return EXIT_SUCCESS;
}